

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_copyRawBlock(void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  
  if (dst == (void *)0x0) {
    if (srcSize == 0) {
      dst_local = (void *)0x0;
    }
    else {
      dst_local = (void *)0xffffffffffffffb6;
    }
  }
  else if (dstCapacity < srcSize) {
    dst_local = (void *)0xffffffffffffffba;
  }
  else {
    memcpy(dst,src,srcSize);
    dst_local = (void *)srcSize;
  }
  return (size_t)dst_local;
}

Assistant:

static size_t ZSTD_copyRawBlock(void* dst, size_t dstCapacity,
                          const void* src, size_t srcSize)
{
    DEBUGLOG(5, "ZSTD_copyRawBlock");
    if (dst == NULL) {
        if (srcSize == 0) return 0;
        return ERROR(dstBuffer_null);
    }
    if (srcSize > dstCapacity) return ERROR(dstSize_tooSmall);
    memcpy(dst, src, srcSize);
    return srcSize;
}